

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewWritableFile
          (InMemoryEnv *this,string *fname,WritableFile **result)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  FileState *this_01;
  mapped_type *ppFVar3;
  undefined8 *puVar4;
  undefined8 *in_RCX;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&fname->field_2);
  if (iVar1 == 0) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
               *)((long)&fname[1].field_2 + 8);
    iVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
            ::find(this_00,(key_type *)result);
    if (iVar2._M_node == (_Base_ptr)(fname + 2)) {
      this_01 = (FileState *)operator_new(0x78);
      (this_01->refs_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this_01->refs_mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(this_01->refs_mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
      (this_01->refs_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      *(undefined8 *)
       ((long)&(this_01->refs_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev + 4) = 0;
      *(undefined8 *)
       ((long)&(this_01->refs_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next + 4) = 0;
      (this_01->blocks_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this_01->blocks_mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(this_01->blocks_mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
      (this_01->blocks_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (this_01->blocks_mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      (this_01->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_01->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_01->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01->size_ = 0;
      FileState::Ref(this_01);
      ppFVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                ::operator[](this_00,(key_type *)result);
      *ppFVar3 = this_01;
    }
    else {
      this_01 = *(FileState **)(iVar2._M_node + 2);
      FileState::Truncate(this_01);
    }
    puVar4 = (undefined8 *)operator_new(0x10);
    *puVar4 = &PTR__WritableFileImpl_0017d098;
    puVar4[1] = this_01;
    FileState::Ref(this_01);
    *in_RCX = puVar4;
    (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&fname->field_2);
    return (Status)(char *)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

Status NewWritableFile(const std::string& fname,
                         WritableFile** result) override {
    MutexLock lock(&mutex_);
    FileSystem::iterator it = file_map_.find(fname);

    FileState* file;
    if (it == file_map_.end()) {
      // File is not currently open.
      file = new FileState();
      file->Ref();
      file_map_[fname] = file;
    } else {
      file = it->second;
      file->Truncate();
    }

    *result = new WritableFileImpl(file);
    return Status::OK();
  }